

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::SyncToSetAndContinueInst<false>::Exec
          (SyncToSetAndContinueInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  Char CVar1;
  bool bVar2;
  Type pRVar3;
  uint uVar4;
  
  pRVar3 = matcher->stats;
  if (pRVar3 != (Type)0x0) {
    pRVar3->numCompares = pRVar3->numCompares + 1;
  }
  uVar4 = *inputOffset;
  if (uVar4 < inputLength) {
    do {
      CVar1 = input[uVar4];
      if ((ushort)CVar1 < 0x100) {
        if (((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar1 >> 5] >>
             ((ushort)CVar1 & 0x1f) & 1) != 0) break;
      }
      else if ((this->super_SetMixin<false>).set.root != (CharSetNode *)0x0) {
        bVar2 = RuntimeCharSet<char16_t>::Get_helper
                          (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar1);
        if (bVar2) {
          uVar4 = *inputOffset;
          break;
        }
        pRVar3 = matcher->stats;
      }
      if (pRVar3 != (Type)0x0) {
        pRVar3->numCompares = pRVar3->numCompares + 1;
      }
      uVar4 = *inputOffset + 1;
      *inputOffset = uVar4;
    } while (uVar4 < inputLength);
  }
  *matchStart = uVar4;
  *instPointer = *instPointer + 0x29;
  return false;
}

Assistant:

inline bool SyncToSetAndContinueInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif

        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        matchStart = inputOffset;
        instPointer += sizeof(*this);
        return false;
    }